

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall HighsMipSolverData::removeFixedIndices(HighsMipSolverData *this)

{
  anon_class_8_1_8991fb9c_for__M_pred in_RDI;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffec8;
  vector<int,_std::allocator<int>_> *this_00;
  const_iterator in_stack_fffffffffffffef0;
  const_iterator __last;
  const_iterator in_stack_fffffffffffffef8;
  
  this_00 = &(in_RDI.this)->integral_cols;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsMipSolverData::removeFixedIndices()::__0>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef8._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef0._M_current,(anon_class_8_1_8991fb9c_for__M_pred)in_RDI.this);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)in_RDI.this,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsMipSolverData::removeFixedIndices()::__1>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef8._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef0._M_current,(anon_class_8_1_8991fb9c_for__M_pred)in_RDI.this);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)in_RDI.this,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsMipSolverData::removeFixedIndices()::__2>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef8._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef0._M_current,(anon_class_8_1_8991fb9c_for__M_pred)in_RDI.this);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)in_RDI.this,in_stack_fffffffffffffef8,
             in_stack_fffffffffffffef0);
  __last._M_current = (int *)&(in_RDI.this)->continuous_cols;
  std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  std::
  remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsMipSolverData::removeFixedIndices()::__3>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             in_stack_fffffffffffffef8._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last._M_current,
             in_RDI);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffffec8);
  __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
  __normal_iterator<int*>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)this_00,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
             in_stack_fffffffffffffec8);
  std::vector<int,_std::allocator<int>_>::erase
            ((vector<int,_std::allocator<int>_> *)in_RDI.this,in_stack_fffffffffffffef8,__last);
  return;
}

Assistant:

void HighsMipSolverData::removeFixedIndices() {
  integral_cols.erase(
      std::remove_if(integral_cols.begin(), integral_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      integral_cols.end());
  integer_cols.erase(
      std::remove_if(integer_cols.begin(), integer_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      integer_cols.end());
  implint_cols.erase(
      std::remove_if(implint_cols.begin(), implint_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      implint_cols.end());
  continuous_cols.erase(
      std::remove_if(continuous_cols.begin(), continuous_cols.end(),
                     [&](HighsInt col) { return domain.isFixed(col); }),
      continuous_cols.end());
}